

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O3

char * __thiscall
CoreML::Specification::SupportVectorRegressor::_InternalParse
          (SupportVectorRegressor *this,char *ptr,ParseContext *ctx)

{
  InternalMetadata *this_00;
  byte bVar1;
  ulong uVar2;
  bool bVar3;
  DenseSupportVectors *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *unknown;
  double *pdVar4;
  Arena *pAVar5;
  char cVar6;
  uint res;
  pair<const_char_*,_unsigned_int> pVar7;
  double *local_38;
  
  local_38 = (double *)ptr;
  bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                    (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
  if (!bVar3) {
    this_00 = &(this->super_MessageLite)._internal_metadata_;
    do {
      bVar1 = *(byte *)local_38;
      res = (uint)bVar1;
      pdVar4 = (double *)((long)local_38 + 1);
      if ((char)bVar1 < '\0') {
        res = ((uint)bVar1 + (uint)*(byte *)pdVar4 * 0x80) - 0x80;
        if ((char)*(byte *)pdVar4 < '\0') {
          pVar7 = google::protobuf::internal::ReadTagFallback((char *)local_38,res);
          pdVar4 = (double *)pVar7.first;
          res = pVar7.second;
        }
        else {
          pdVar4 = (double *)((long)local_38 + 2);
        }
      }
      cVar6 = (char)res;
      local_38 = pdVar4;
      switch(res >> 3) {
      case 1:
        if (cVar6 != '\n') break;
        msg = (DenseSupportVectors *)this->kernel_;
        if (msg == (DenseSupportVectors *)0x0) {
          pAVar5 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
          if ((this_00->ptr_ & 1U) != 0) {
            pAVar5 = *(Arena **)pAVar5;
          }
          msg = (DenseSupportVectors *)
                google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Kernel>(pAVar5);
          this->kernel_ = (Kernel *)msg;
        }
LAB_002c055e:
        local_38 = (double *)
                   google::protobuf::internal::ParseContext::ParseMessage
                             (ctx,&msg->super_MessageLite,(char *)local_38);
        goto LAB_002c0569;
      case 2:
        if (cVar6 == '\x12') {
          if (this->_oneof_case_[0] == 2) goto LAB_002c04f0;
          clear_supportVectors(this);
          this->_oneof_case_[0] = 2;
          uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
          pAVar5 = (Arena *)(uVar2 & 0xfffffffffffffffc);
          if ((uVar2 & 1) != 0) {
            pAVar5 = *(Arena **)pAVar5;
          }
          msg = (DenseSupportVectors *)
                google::protobuf::Arena::
                CreateMaybeMessage<CoreML::Specification::SparseSupportVectors>(pAVar5);
LAB_002c0553:
          (this->supportVectors_).densesupportvectors_ = msg;
          goto LAB_002c055e;
        }
        break;
      case 3:
        if (cVar6 == '\x1a') {
          if (this->_oneof_case_[0] != 3) {
            clear_supportVectors(this);
            this->_oneof_case_[0] = 3;
            uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
            pAVar5 = (Arena *)(uVar2 & 0xfffffffffffffffc);
            if ((uVar2 & 1) != 0) {
              pAVar5 = *(Arena **)pAVar5;
            }
            msg = google::protobuf::Arena::
                  CreateMaybeMessage<CoreML::Specification::DenseSupportVectors>(pAVar5);
            goto LAB_002c0553;
          }
LAB_002c04f0:
          msg = (DenseSupportVectors *)(this->supportVectors_).sparsesupportvectors_;
          goto LAB_002c055e;
        }
        break;
      case 4:
        if (cVar6 == '\"') {
          msg = (DenseSupportVectors *)this->coefficients_;
          if (msg == (DenseSupportVectors *)0x0) {
            pAVar5 = (Arena *)(this_00->ptr_ & 0xfffffffffffffffc);
            if ((this_00->ptr_ & 1U) != 0) {
              pAVar5 = *(Arena **)pAVar5;
            }
            msg = (DenseSupportVectors *)
                  google::protobuf::Arena::CreateMaybeMessage<CoreML::Specification::Coefficients>
                            (pAVar5);
            this->coefficients_ = (Coefficients *)msg;
          }
          goto LAB_002c055e;
        }
        break;
      case 5:
        if (cVar6 != ')') break;
        this->rho_ = *pdVar4;
        local_38 = pdVar4 + 1;
        goto LAB_002c0572;
      }
      if ((res == 0) || ((res & 7) == 4)) {
        if (pdVar4 == (double *)0x0) {
          return (char *)0x0;
        }
        (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = res - 1;
        return (char *)pdVar4;
      }
      if ((this_00->ptr_ & 1U) == 0) {
        unknown = google::protobuf::internal::InternalMetadata::
                  mutable_unknown_fields_slow<std::__cxx11::string>(this_00);
      }
      else {
        unknown = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  ((this_00->ptr_ & 0xfffffffffffffffcU) + 8);
      }
      local_38 = (double *)
                 google::protobuf::internal::UnknownFieldParse(res,unknown,(char *)local_38,ctx);
LAB_002c0569:
      if (local_38 == (double *)0x0) {
        return (char *)0x0;
      }
LAB_002c0572:
      bVar3 = google::protobuf::internal::EpsCopyInputStream::DoneWithCheck
                        (&ctx->super_EpsCopyInputStream,(char **)&local_38,ctx->group_depth_);
    } while (!bVar3);
  }
  return (char *)local_38;
}

Assistant:

const char* SupportVectorRegressor::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  while (!ctx->Done(&ptr)) {
    uint32_t tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    switch (tag >> 3) {
      // .CoreML.Specification.Kernel kernel = 1;
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 10)) {
          ptr = ctx->ParseMessage(_internal_mutable_kernel(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.SparseSupportVectors sparseSupportVectors = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 18)) {
          ptr = ctx->ParseMessage(_internal_mutable_sparsesupportvectors(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.DenseSupportVectors denseSupportVectors = 3;
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 26)) {
          ptr = ctx->ParseMessage(_internal_mutable_densesupportvectors(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // .CoreML.Specification.Coefficients coefficients = 4;
      case 4:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 34)) {
          ptr = ctx->ParseMessage(_internal_mutable_coefficients(), ptr);
          CHK_(ptr);
        } else
          goto handle_unusual;
        continue;
      // double rho = 5;
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<uint8_t>(tag) == 41)) {
          rho_ = ::PROTOBUF_NAMESPACE_ID::internal::UnalignedLoad<double>(ptr);
          ptr += sizeof(double);
        } else
          goto handle_unusual;
        continue;
      default:
        goto handle_unusual;
    }  // switch
  handle_unusual:
    if ((tag == 0) || ((tag & 7) == 4)) {
      CHK_(ptr);
      ctx->SetLastTag(tag);
      goto message_done;
    }
    ptr = UnknownFieldParse(
        tag,
        _internal_metadata_.mutable_unknown_fields<std::string>(),
        ptr, ctx);
    CHK_(ptr != nullptr);
  }  // while
message_done:
  return ptr;
failure:
  ptr = nullptr;
  goto message_done;
#undef CHK_
}